

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

string_view __thiscall mserialize::string_view::substr(string_view *this,size_type pos,size_type n)

{
  ulong uVar1;
  out_of_range *this_00;
  size_type sVar2;
  string_view sVar3;
  
  uVar1 = this->_len;
  if (pos <= uVar1) {
    sVar2 = n;
    if (uVar1 < n + pos) {
      sVar2 = uVar1 - pos;
    }
    if (n == 0xffffffffffffffff) {
      sVar2 = uVar1 - pos;
    }
    sVar3._len = sVar2;
    sVar3._ptr = this->_ptr + pos;
    return sVar3;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"mserialize::string_view::substr");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

constexpr size_type size() const noexcept { return _len; }